

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void * ImFileLoadToMemory(char *filename,char *mode,size_t *out_file_size,int padding_bytes)

{
  ImFileHandle f_00;
  ImU64 count;
  ImU64 IVar1;
  void *file_data;
  size_t file_size;
  ImFileHandle f;
  int padding_bytes_local;
  size_t *out_file_size_local;
  char *mode_local;
  char *filename_local;
  
  if (filename == (char *)0x0 || mode == (char *)0x0) {
    __assert_fail("filename && mode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x627,"void *ImFileLoadToMemory(const char *, const char *, size_t *, int)");
  }
  if (out_file_size != (size_t *)0x0) {
    *out_file_size = 0;
  }
  f_00 = ImFileOpen(filename,mode);
  if (f_00 == (ImFileHandle)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    count = ImFileGetSize(f_00);
    if (count == 0xffffffffffffffff) {
      ImFileClose(f_00);
      filename_local = (char *)0x0;
    }
    else {
      filename_local = (char *)ImGui::MemAlloc(count + (long)padding_bytes);
      if (filename_local == (char *)0x0) {
        ImFileClose(f_00);
        filename_local = (char *)0x0;
      }
      else {
        IVar1 = ImFileRead(filename_local,1,count,f_00);
        if (IVar1 == count) {
          if (0 < padding_bytes) {
            memset(filename_local + count,0,(long)padding_bytes);
          }
          ImFileClose(f_00);
          if (out_file_size != (size_t *)0x0) {
            *out_file_size = count;
          }
        }
        else {
          ImFileClose(f_00);
          ImGui::MemFree(filename_local);
          filename_local = (char *)0x0;
        }
      }
    }
  }
  return filename_local;
}

Assistant:

void*   ImFileLoadToMemory(const char* filename, const char* mode, size_t* out_file_size, int padding_bytes)
{
    IM_ASSERT(filename && mode);
    if (out_file_size)
        *out_file_size = 0;

    ImFileHandle f;
    if ((f = ImFileOpen(filename, mode)) == NULL)
        return NULL;

    size_t file_size = (size_t)ImFileGetSize(f);
    if (file_size == (size_t)-1)
    {
        ImFileClose(f);
        return NULL;
    }

    void* file_data = IM_ALLOC(file_size + padding_bytes);
    if (file_data == NULL)
    {
        ImFileClose(f);
        return NULL;
    }
    if (ImFileRead(file_data, 1, file_size, f) != file_size)
    {
        ImFileClose(f);
        IM_FREE(file_data);
        return NULL;
    }
    if (padding_bytes > 0)
        memset((void*)(((char*)file_data) + file_size), 0, (size_t)padding_bytes);

    ImFileClose(f);
    if (out_file_size)
        *out_file_size = file_size;

    return file_data;
}